

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_Star_Test.cpp
# Opt level: O2

void __thiscall
Planner_Goal_Point_Test_Test::~Planner_Goal_Point_Test_Test(Planner_Goal_Point_Test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Planner, Goal_Point_Test) {
  auto coordinate = path[0];
  std::vector<int> Test_Node = { coordinate.x, coordinate.y, coordinate.z };
  std::vector<double> Coordinates = Map.Get_Coordinate(Test_Node);
  ASSERT_EQ(Coordinates[0], 2);
  ASSERT_EQ(Coordinates[1], 2);
  ASSERT_EQ(Coordinates[2], 2);
}